

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O0

void RansDecInit(RansState *r,uint8_t **pptr)

{
  RansState RVar1;
  uint8_t *ptr;
  uint32_t x;
  uint8_t **pptr_local;
  RansState *r_local;
  
  RVar1 = *(RansState *)*pptr;
  *pptr = (uint8_t *)((long)*pptr + 4);
  *r = RVar1;
  return;
}

Assistant:

static inline void RansDecInit(RansState* r, uint8_t** pptr)
{
    uint32_t x;
    uint8_t* ptr = *pptr;

    x  = ptr[0] << 0;
    x |= ptr[1] << 8;
    x |= ptr[2] << 16;
    x |= ptr[3] << 24;
    ptr += 4;

    *pptr = ptr;
    *r = x;
}